

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O0

int __thiscall pg::PPSolver::getRegionStatus(PPSolver *this,int i,int p)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  reference piVar5;
  Error *this_00;
  bool bVar6;
  int r;
  int to_1;
  int *curedge_1;
  iterator iStack_50;
  int j_1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int lowest;
  int to;
  int *curedge;
  int j;
  int pl;
  int p_local;
  int i_local;
  PPSolver *this_local;
  
  curedge._0_4_ = i;
  while( true ) {
    bVar6 = false;
    if (-1 < (int)curedge) {
      iVar3 = Solver::priority(&this->super_Solver,(int)curedge);
      bVar6 = iVar3 == p;
    }
    if (!bVar6) break;
    bVar6 = bitset::operator[]((this->super_Solver).disabled,(long)(int)curedge);
    if ((!bVar6) && (this->region[(int)curedge] <= p)) {
      uVar4 = Solver::owner(&this->super_Solver,(int)curedge);
      if (uVar4 == (p & 1U)) {
        if (this->strategy[(int)curedge] == -1) {
          return -2;
        }
      }
      else {
        for (_lowest = Solver::outs(&this->super_Solver,(int)curedge); *_lowest != -1;
            _lowest = _lowest + 1) {
          iVar3 = *_lowest;
          bVar6 = bitset::operator[]((this->super_Solver).disabled,(long)iVar3);
          if ((!bVar6) && (this->region[iVar3] < p)) {
            return -2;
          }
        }
      }
    }
    curedge._0_4_ = (int)curedge + -1;
  }
  __range1._0_4_ = -1;
  pvVar1 = this->regions;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(pvVar1 + p);
  iStack_50 = std::vector<int,_std::allocator<int>_>::end(pvVar1 + p);
  do {
    bVar6 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb0);
    if (!bVar6) {
      return (int)__range1;
    }
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    iVar3 = *piVar5;
    uVar4 = Solver::owner(&this->super_Solver,iVar3);
    if (uVar4 != (p & 1U)) {
      for (_r = Solver::outs(&this->super_Solver,iVar3); *_r != -1; _r = _r + 1) {
        iVar3 = *_r;
        bVar6 = bitset::operator[]((this->super_Solver).disabled,(long)iVar3);
        iVar2 = (int)__range1;
        if ((!bVar6) &&
           (((iVar3 = this->region[iVar3], iVar3 <= p ||
             ((iVar2 = iVar3, (int)__range1 <= iVar3 && ((int)__range1 != -1)))) &&
            (iVar2 = (int)__range1, iVar3 < p)))) {
          this_00 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(this_00,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                       ,0x108);
          __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
        }
        __range1._0_4_ = iVar2;
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  } while( true );
}

Assistant:

int
PPSolver::getRegionStatus(int i, int p)
{
    const int pl = p&1;

    // check if the region is closed in the subgame
    for (int j=i; j>=0 && priority(j)==p; j--) {
        if (disabled[j] or region[j] > p) {
            // escape not in region
            continue;
        } else if (owner(j) == pl) {
            // region won by escape owner
            // it is therefore closed if it has a strategy
            if (strategy[j] == -1) return -2;
        } else {
            // region lost by escape owner
            // it is therefore closed if there are no edges to lower regions
            for (auto curedge = outs(j); *curedge != -1; curedge++) {
                int to =*curedge;
                if (disabled[to]) continue;
                if (region[to] < p) return -2; // open
            }
        }
    }
    // closed in the subgame, so find lowest higher region for possible promotion
    int lowest = -1;
    for (int j : regions[p]) {
        if (owner(j) != pl) {
            // losing node, find lowest higher ...
            for (auto curedge = outs(j); *curedge != -1; curedge++) {
                int to = *curedge;
                /** HOT SPOT of the iterator and minor hot spot of obtaining the region **/
                if (disabled[to]) continue;
                int r = region[to];
                if (r > p && (r < lowest || lowest == -1)) lowest = r;
                else if (r < p) LOGIC_ERROR;
            }
        }
    }
    return lowest; // -1 if dominion, <region> otherwise
}